

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void __thiscall amrex::expect::expect(expect *this,char c)

{
  char in_SIL;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator+=(in_RDI,in_SIL);
  return;
}

Assistant:

amrex::expect::expect(char c)
{
    istr += c;
}